

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void addArgumentToVtab(Parse *pParse)

{
  char *__src;
  Table *pTable;
  char *zArg;
  size_t __n;
  
  __src = (pParse->sArg).z;
  if ((__src != (char *)0x0) && (pTable = pParse->pNewTable, pTable != (Table *)0x0)) {
    __n = (size_t)(int)(pParse->sArg).n;
    zArg = (char *)sqlite3DbMallocRawNN(pParse->db,__n + 1);
    if (zArg != (char *)0x0) {
      memcpy(zArg,__src,__n);
      zArg[__n] = '\0';
    }
    addModuleArgument(pParse,pTable,zArg);
    return;
  }
  return;
}

Assistant:

static void addArgumentToVtab(Parse *pParse){
  if( pParse->sArg.z && pParse->pNewTable ){
    const char *z = (const char*)pParse->sArg.z;
    int n = pParse->sArg.n;
    sqlite3 *db = pParse->db;
    addModuleArgument(pParse, pParse->pNewTable, sqlite3DbStrNDup(db, z, n));
  }
}